

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O1

HelicsBool helicsDataBufferToBoolean(HelicsDataBuffer data)

{
  DataType baseType;
  uint uVar1;
  Message *pMVar2;
  bool val;
  bool local_29;
  data_view local_28;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar2 = getMessageObj(data,(HelicsError *)0x0);
    data = &pMVar2->data;
    if (pMVar2 == (Message *)0x0) {
      data = (SmallBuffer *)0x0;
    }
  }
  if ((SmallBuffer *)data == (SmallBuffer *)0x0) {
    uVar1 = 0;
  }
  else {
    local_28.dblock._M_len = ((SmallBuffer *)data)->bufferSize;
    local_28.dblock._M_str = (char *)((SmallBuffer *)data)->heap;
    local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    baseType = helics::detail::detectType((byte *)local_28.dblock._M_str);
    helics::valueExtract(&local_28,baseType,&local_29);
    if (local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.ref.
                 super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    uVar1 = (uint)local_29;
  }
  return uVar1;
}

Assistant:

HelicsBool helicsDataBufferToBoolean(HelicsDataBuffer data)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return HELICS_FALSE;
    }
    bool val;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), val);
    return (val) ? HELICS_TRUE : HELICS_FALSE;
}